

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O1

bool __thiscall
Assimp::LWOImporter::HandleTextures
          (LWOImporter *this,aiMaterial *pcMat,TextureList *in,aiTextureType type)

{
  int iVar1;
  pointer pCVar2;
  ulong __n;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  aiTextureType type_00;
  size_type sVar6;
  size_type sVar7;
  Logger *pLVar8;
  pointer pCVar9;
  uint uVar10;
  uint uVar11;
  pointer pCVar12;
  _List_node_base *p_Var13;
  undefined4 uVar14;
  uint temp;
  int mapping_;
  aiString s;
  uint local_48c;
  undefined4 local_488;
  uint local_484;
  aiMaterial *local_480;
  aiTextureType local_478;
  undefined4 local_474;
  undefined4 uStack_470;
  undefined4 local_46c;
  string local_468;
  _List_node_base *local_448;
  LWOImporter *local_440;
  aiString local_434;
  
  local_440 = this;
  if (pcMat == (aiMaterial *)0x0) {
    __assert_fail("__null != pcMat",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/LWO/LWOMaterial.cpp"
                  ,0x59,
                  "bool Assimp::LWOImporter::HandleTextures(aiMaterial *, const TextureList &, aiTextureType)"
                 );
  }
  uVar10 = 0;
  local_48c = 0;
  local_434.length = 0;
  local_434.data._0_8_ = local_434.data._0_8_ & 0xffffffffffffff00;
  memset(local_434.data + 1,0x1b,0x3ff);
  p_Var13 = (in->super__List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var13 != (_List_node_base *)in) {
    uVar11 = uVar10;
    uVar10 = 0;
    local_480 = pcMat;
    local_478 = type;
    local_448 = (_List_node_base *)in;
    do {
      if ((*(char *)((long)&p_Var13[6]._M_next + 4) == '\x01') &&
         (*(undefined1 *)((long)&p_Var13[6]._M_prev + 4) == '\x01')) {
        switch(*(undefined4 *)&p_Var13[7]._M_next) {
        case 0:
          local_488 = 4;
          break;
        case 1:
          local_488 = 2;
          bVar5 = 1;
          goto LAB_00430d7e;
        case 2:
          local_488 = 1;
          bVar4 = 1;
          bVar3 = false;
          bVar5 = 0;
          goto LAB_00430d81;
        case 3:
          local_488 = 3;
          break;
        case 4:
          pLVar8 = DefaultLogger::get();
          Logger::error(pLVar8,"LWO2: Unsupported texture mapping: FrontProjection");
          local_488 = 5;
          break;
        case 5:
          if (*(uint *)&p_Var13[6]._M_next != 0xffffffff) {
            local_48c = *(uint *)&p_Var13[6]._M_next;
            aiMaterial::AddBinaryProperty
                      (pcMat,&local_48c,4,"$tex.uvwsrc",type,uVar11,aiPTI_Integer);
            bVar5 = 0;
            bVar3 = true;
            bVar4 = 0;
            local_488 = 0;
            goto LAB_00430d81;
          }
          goto LAB_00431298;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/LWO/LWOMaterial.cpp"
                        ,0x8a,
                        "bool Assimp::LWOImporter::HandleTextures(aiMaterial *, const TextureList &, aiTextureType)"
                       );
        }
        bVar5 = 0;
LAB_00430d7e:
        bVar3 = false;
        bVar4 = 0;
LAB_00430d81:
        if (!bVar3) {
          iVar1 = *(int *)((long)&p_Var13[7]._M_next + 4);
          if (iVar1 == 1) {
            local_474 = 0;
            local_46c = 0;
            uVar14 = 0x3f800000;
          }
          else if (iVar1 == 0) {
            local_474 = 0x3f800000;
            uVar14 = 0;
            local_46c = 0;
          }
          else {
            local_474 = 0;
            uVar14 = 0;
            local_46c = 0x3f800000;
          }
          _local_474 = CONCAT44(uVar14,local_474);
          aiMaterial::AddBinaryProperty
                    (local_480,&local_474,0xc,"$tex.mapaxis",type,uVar11,aiPTI_Float);
          if ((bool)(bVar5 | bVar4)) {
            local_468._M_dataplus._M_p = (pointer)0x0;
            local_468.field_2._M_allocated_capacity._0_4_ = 0;
            local_468._M_string_length =
                 CONCAT44(*(undefined4 *)&p_Var13[7]._M_prev,
                          *(undefined4 *)((long)&p_Var13[7]._M_prev + 4));
            aiMaterial::AddBinaryProperty
                      (local_480,&local_468,0x14,"$tex.uvtrafo",type,uVar11,aiPTI_Float);
          }
          pLVar8 = DefaultLogger::get();
          Logger::debug(pLVar8,"LWO2: Setting up non-UV mapping");
        }
        pcMat = local_480;
        local_484 = uVar11;
        if (local_440->mIsLWO2 == true) {
          pCVar2 = (local_440->mClips).
                   super__Vector_base<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>._M_impl
                   .super__Vector_impl_data._M_finish;
          local_48c = *(uint *)&p_Var13[3]._M_next;
          pCVar12 = pCVar2;
          for (pCVar9 = (local_440->mClips).
                        super__Vector_base<Assimp::LWO::Clip,_std::allocator<Assimp::LWO::Clip>_>.
                        _M_impl.super__Vector_impl_data._M_start; pCVar9 != pCVar2;
              pCVar9 = pCVar9 + 1) {
            if (pCVar9->idx == local_48c) {
              pCVar12 = pCVar9;
            }
          }
          if (pCVar12 == pCVar2) {
            pLVar8 = DefaultLogger::get();
            Logger::error(pLVar8,"LWO2: Clip index is out of bounds");
            local_48c = 0;
            local_434.length = 0xc;
            builtin_strncpy(local_434.data,"$texture.png",0xd);
            uVar11 = local_484;
          }
          else {
            if (pCVar12->type == UNSUPPORTED) {
              pLVar8 = DefaultLogger::get();
              Logger::error(pLVar8,"LWO2: Clip type is not supported");
              uVar10 = 1;
              in = (TextureList *)local_448;
              uVar11 = local_484;
              goto LAB_0043129a;
            }
            AdjustTexturePath(local_440,&pCVar12->path);
            __n = (pCVar12->path)._M_string_length;
            if (__n < 0x400) {
              local_434.length = (ai_uint32)__n;
              memcpy(local_434.data,(pCVar12->path)._M_dataplus._M_p,__n);
              local_434.data[__n] = '\0';
            }
            pcMat = local_480;
            uVar11 = local_484;
            local_468._M_dataplus._M_p =
                 (pointer)CONCAT44((int)((ulong)local_468._M_dataplus._M_p >> 0x20),
                                   (uint)pCVar12->negate);
            aiMaterial::AddBinaryProperty
                      (local_480,&local_468,4,"$tex.flags",type,local_484,aiPTI_Integer);
          }
LAB_004310bc:
          aiMaterial::AddProperty(pcMat,&local_434,"$tex.file",type,uVar11);
          aiMaterial::AddBinaryProperty
                    (pcMat,(_List_node_base **)((long)&p_Var13[3]._M_next + 4),4,"$tex.blend",type,
                     uVar11,aiPTI_Float);
          switch(*(undefined4 *)&p_Var13[6]._M_prev) {
          case 0:
          case 3:
            local_48c = 0;
            break;
          case 1:
          case 2:
            local_48c = 2;
            break;
          case 4:
            local_48c = 3;
            break;
          default:
            local_48c = 0;
            pLVar8 = DefaultLogger::get();
            Logger::warn(pLVar8,"LWO2: Unsupported texture blend mode: alpha or displacement");
            break;
          case 7:
            local_48c = 1;
          }
          type_00 = local_478;
          uVar10 = local_484;
          aiMaterial::AddBinaryProperty
                    (pcMat,&local_48c,4,"$tex.op",local_478,local_484,aiPTI_Integer);
          local_468._M_dataplus._M_p._0_4_ = local_488;
          aiMaterial::AddBinaryProperty
                    (pcMat,&local_468,4,"$tex.mapping",type_00,uVar10,aiPTI_Integer);
          iVar1 = *(int *)&p_Var13[8]._M_next;
          if (iVar1 == 0) {
            pLVar8 = DefaultLogger::get();
            Logger::warn(pLVar8,"LWO2: Unsupported texture map mode: RESET");
LAB_004311f9:
            local_48c = 1;
          }
          else {
            if (iVar1 == 3) goto LAB_004311f9;
            local_48c = 0;
            if (iVar1 == 2) {
              local_48c = 2;
            }
          }
          in = (TextureList *)local_448;
          type = local_478;
          uVar11 = local_484;
          aiMaterial::AddBinaryProperty
                    (pcMat,&local_48c,4,"$tex.mapmodeu",local_478,local_484,aiPTI_Integer);
          iVar1 = *(int *)((long)&p_Var13[8]._M_next + 4);
          if (iVar1 == 0) {
            pLVar8 = DefaultLogger::get();
            Logger::warn(pLVar8,"LWO2: Unsupported texture map mode: RESET");
LAB_00431267:
            local_48c = 1;
          }
          else {
            if (iVar1 == 3) goto LAB_00431267;
            local_48c = 0;
            if (iVar1 == 2) {
              local_48c = 2;
            }
          }
          aiMaterial::AddBinaryProperty
                    (pcMat,&local_48c,4,"$tex.mapmodev",type,uVar11,aiPTI_Integer);
          uVar11 = uVar11 + 1;
        }
        else {
          local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_468,p_Var13[1]._M_next,
                     (long)&(p_Var13[1]._M_prev)->_M_next + (long)p_Var13[1]._M_next);
          sVar6 = local_468._M_string_length;
          if (local_468._M_string_length == 0) {
            pLVar8 = DefaultLogger::get();
            Logger::warn(pLVar8,"LWOB: Empty file name");
          }
          else {
            AdjustTexturePath(local_440,&local_468);
            sVar7 = local_468._M_string_length;
            if (local_468._M_string_length < 0x400) {
              local_434.length = (ai_uint32)local_468._M_string_length;
              memcpy(local_434.data,local_468._M_dataplus._M_p,local_468._M_string_length);
              local_434.data[sVar7] = '\0';
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_468._M_dataplus._M_p != &local_468.field_2) {
            operator_delete(local_468._M_dataplus._M_p);
          }
          pcMat = local_480;
          if (sVar6 != 0) goto LAB_004310bc;
        }
LAB_00431298:
        uVar10 = 1;
      }
LAB_0043129a:
      p_Var13 = (((_List_base<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_> *)
                 &p_Var13->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var13 != (_List_node_base *)in);
  }
  return SUB41(uVar10,0);
}

Assistant:

bool LWOImporter::HandleTextures(aiMaterial* pcMat, const TextureList& in, aiTextureType type)
{
    ai_assert(NULL != pcMat);

    unsigned int cur = 0, temp = 0;
    aiString s;
    bool ret = false;

    for (const auto &texture : in)    {
        if (!texture.enabled || !texture.bCanUse)
            continue;
        ret = true;

        // Convert lightwave's mapping modes to ours. We let them
        // as they are, the GenUVcoords step will compute UV
        // channels if they're not there.

        aiTextureMapping mapping;
        switch (texture.mapMode)
        {
            case LWO::Texture::Planar:
                mapping = aiTextureMapping_PLANE;
                break;
            case LWO::Texture::Cylindrical:
                mapping = aiTextureMapping_CYLINDER;
                break;
            case LWO::Texture::Spherical:
                mapping = aiTextureMapping_SPHERE;
                break;
            case LWO::Texture::Cubic:
                mapping = aiTextureMapping_BOX;
                break;
            case LWO::Texture::FrontProjection:
                ASSIMP_LOG_ERROR("LWO2: Unsupported texture mapping: FrontProjection");
                mapping = aiTextureMapping_OTHER;
                break;
            case LWO::Texture::UV:
                {
                    if( UINT_MAX == texture.mRealUVIndex ) {
                        // We have no UV index for this texture, so we can't display it
                        continue;
                    }

                    // add the UV source index
                    temp = texture.mRealUVIndex;
                    pcMat->AddProperty<int>((int*)&temp,1,AI_MATKEY_UVWSRC(type,cur));

                    mapping = aiTextureMapping_UV;
                }
                break;
            default:
                ai_assert(false);
        };

        if (mapping != aiTextureMapping_UV) {
            // Setup the main axis
            aiVector3D v;
            switch (texture.majorAxis) {
                case Texture::AXIS_X:
                    v = aiVector3D(1.0,0.0,0.0);
                    break;
                case Texture::AXIS_Y:
                    v = aiVector3D(0.0,1.0,0.0);
                    break;
                default: // case Texture::AXIS_Z:
                    v = aiVector3D(0.0,0.0,1.0);
                    break;
            }

            pcMat->AddProperty(&v,1,AI_MATKEY_TEXMAP_AXIS(type,cur));

            // Setup UV scalings for cylindric and spherical projections
            if (mapping == aiTextureMapping_CYLINDER || mapping == aiTextureMapping_SPHERE) {
                aiUVTransform trafo;
                trafo.mScaling.x = texture.wrapAmountW;
                trafo.mScaling.y = texture.wrapAmountH;

                static_assert(sizeof(aiUVTransform)/sizeof(ai_real) == 5, "sizeof(aiUVTransform)/sizeof(ai_real) == 5");
                pcMat->AddProperty(&trafo,1,AI_MATKEY_UVTRANSFORM(type,cur));
            }
            ASSIMP_LOG_DEBUG("LWO2: Setting up non-UV mapping");
        }

        // The older LWOB format does not use indirect references to clips.
        // The file name of a texture is directly specified in the tex chunk.
        if (mIsLWO2)    {
            // find the corresponding clip (take the last one if multiple
            // share the same index)
            ClipList::iterator end = mClips.end(), candidate = end;
            temp = texture.mClipIdx;
            for (ClipList::iterator clip = mClips.begin(); clip != end; ++clip) {
                if ((*clip).idx == temp) {
                    candidate = clip;
                }

            }
            if (candidate == end)   {
                ASSIMP_LOG_ERROR("LWO2: Clip index is out of bounds");
                temp = 0;

                // fixme: apparently some LWO files shipping with Doom3 don't
                // have clips at all ... check whether that's true or whether
                // it's a bug in the loader.

                s.Set("$texture.png");

                //continue;
            }
            else {
                if (Clip::UNSUPPORTED == (*candidate).type) {
                    ASSIMP_LOG_ERROR("LWO2: Clip type is not supported");
                    continue;
                }
                AdjustTexturePath((*candidate).path);
                s.Set((*candidate).path);

                // Additional image settings
                int flags = 0;
                if ((*candidate).negate) {
                    flags |= aiTextureFlags_Invert;
                }
                pcMat->AddProperty(&flags,1,AI_MATKEY_TEXFLAGS(type,cur));
            }
        }
        else
        {
            std::string ss = texture.mFileName;
            if (!ss.length()) {
                ASSIMP_LOG_WARN("LWOB: Empty file name");
                continue;
            }
            AdjustTexturePath(ss);
            s.Set(ss);
        }
        pcMat->AddProperty(&s,AI_MATKEY_TEXTURE(type,cur));

        // add the blend factor
        pcMat->AddProperty<float>(&texture.mStrength,1,AI_MATKEY_TEXBLEND(type,cur));

        // add the blend operation
        switch (texture.blendType)
        {
            case LWO::Texture::Normal:
            case LWO::Texture::Multiply:
                temp = (unsigned int)aiTextureOp_Multiply;
                break;

            case LWO::Texture::Subtractive:
            case LWO::Texture::Difference:
                temp = (unsigned int)aiTextureOp_Subtract;
                break;

            case LWO::Texture::Divide:
                temp = (unsigned int)aiTextureOp_Divide;
                break;

            case LWO::Texture::Additive:
                temp = (unsigned int)aiTextureOp_Add;
                break;

            default:
                temp = (unsigned int)aiTextureOp_Multiply;
                ASSIMP_LOG_WARN("LWO2: Unsupported texture blend mode: alpha or displacement");

        }
        // Setup texture operation
        pcMat->AddProperty<int>((int*)&temp,1,AI_MATKEY_TEXOP(type,cur));

        // setup the mapping mode
        int mapping_ = static_cast<int>(mapping);
        pcMat->AddProperty<int>(&mapping_, 1, AI_MATKEY_MAPPING(type, cur));

        // add the u-wrapping
        temp = (unsigned int)GetMapMode(texture.wrapModeWidth);
        pcMat->AddProperty<int>((int*)&temp,1,AI_MATKEY_MAPPINGMODE_U(type,cur));

        // add the v-wrapping
        temp = (unsigned int)GetMapMode(texture.wrapModeHeight);
        pcMat->AddProperty<int>((int*)&temp,1,AI_MATKEY_MAPPINGMODE_V(type,cur));

        ++cur;
    }
    return ret;
}